

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.c
# Opt level: O2

ASTNode * ParseFor(Scope *scope,Lexer *lexer)

{
  uint uVar1;
  Token TVar2;
  int iVar3;
  ASTNode *pAVar4;
  ASTNode *pAVar5;
  char *pcVar6;
  char *pcVar7;
  
  pAVar4 = GetNextNode(scope);
  pAVar4->isStmt = true;
  pAVar4->type = FOR;
  TVar2 = GetNextToken(lexer);
  if (TVar2 == LPAREN) {
    TVar2 = GetNextToken(lexer);
    pAVar5 = ParseVar(scope,lexer,TVar2);
    (pAVar4->meta).binaryExpr.left = pAVar5;
    pAVar5 = ParseExpression(scope,lexer);
    (pAVar4->meta).binaryExpr.right = pAVar5;
    pAVar5 = ParseExpression(scope,lexer);
    (pAVar4->meta).forExpr.inc = pAVar5;
    TVar2 = GetNextToken(lexer);
    if (TVar2 == RPAREN) {
      iVar3 = ParseBody(scope,lexer);
      (pAVar4->meta).forExpr.body = iVar3;
      return pAVar4;
    }
    pcVar6 = TokenToString(TVar2);
    uVar1 = (lexer->tracker).row;
    iVar3 = (lexer->tracker).col + (lexer->tracker).currentTokenPosition;
    pcVar7 = "RPAREN";
  }
  else {
    pcVar6 = TokenToString(TVar2);
    uVar1 = (lexer->tracker).row;
    iVar3 = (lexer->tracker).col + (lexer->tracker).currentTokenPosition;
    pcVar7 = "LPAREN";
  }
  printf("Parse error: Expected: %s, but got: %s, at %d:%d\n",pcVar7,pcVar6,(ulong)uVar1,
         (ulong)(iVar3 - 1));
  exit(0);
}

Assistant:

ASTNode* ParseFor(Scope* scope, Lexer* lexer){
	DEBUG_PRINT_SYNTAX("For");
	TRACK();
	ASTNode* forExpr = GetNextNode(scope);
	SET_IS_STMT(forExpr);
	SET_NODE_TYPE(forExpr, FOR);

	Token tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, LPAREN, lexer);
	tok = GetNextToken(lexer);

	/**
	 * Since this is an internal variable for a for loop,
	 * this will not be a top level statement.
	 */
	ASTNode* var = ParseVar(scope, lexer, tok);

	SET_FOR_VAR(forExpr, var);
	SET_FOR_CONDITION(forExpr, ParseExpression(scope, lexer));
	SET_FOR_INC(forExpr, ParseExpression(scope, lexer));

	tok = GetNextToken(lexer);
	EXPECT_TOKEN(tok, RPAREN, lexer);
	SET_FOR_BODY(forExpr, ParseBody(scope, lexer));
	return forExpr;
}